

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

int __thiscall wallet::CWallet::GetTxBlocksToMaturity(CWallet *this,CWalletTx *wtx)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  CWalletTx *in_RSI;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  int chain_depth;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc,(AnnotatedMixin<std::recursive_mutex> *)0x1711679);
  bVar2 = CWalletTx::IsCoinBase
                    ((CWalletTx *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (bVar2) {
    iVar3 = GetTxDepthInMainChain(in_RDI,in_RSI);
    if (iVar3 < 0) {
      __assert_fail("chain_depth >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                    ,0xd85,"int wallet::CWallet::GetTxBlocksToMaturity(const CWalletTx &) const");
    }
    piVar4 = std::max<int>((int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_14 = *piVar4;
  }
  else {
    local_14 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

int CWallet::GetTxBlocksToMaturity(const CWalletTx& wtx) const
{
    AssertLockHeld(cs_wallet);

    if (!wtx.IsCoinBase()) {
        return 0;
    }
    int chain_depth = GetTxDepthInMainChain(wtx);
    assert(chain_depth >= 0); // coinbase tx should not be conflicted
    return std::max(0, (COINBASE_MATURITY+1) - chain_depth);
}